

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_avx2::forward_inplace
          (Scale_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  float *pfVar18;
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [12];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256 _p_13;
  __m256 _s_13;
  int remain_1;
  int nn_1;
  float s_1;
  float *ptr_13;
  int q_5;
  float *scale_ptr_1;
  __m256 _p_12;
  __m256 _bias_6;
  __m256 _s_12;
  int remain;
  int nn;
  float bias_2;
  float s;
  float *ptr_12;
  int q_4;
  float *bias_ptr;
  float *scale_ptr;
  int size;
  int channels;
  int h;
  int w;
  __m128 _p_11;
  int i_11;
  __m128 _s_11;
  float *ptr_11;
  int q_3;
  __m128 _p_10;
  int i_10;
  __m128 _bias_5;
  __m128 _s_10;
  float *ptr_10;
  int q_2;
  int size_2;
  int channels_2;
  int h_4;
  int w_6;
  __m128 _p_9;
  int j_3;
  __m128 _s_9;
  float *ptr_9;
  int i_9;
  __m128 _p_8;
  int j_2;
  __m128 _bias_4;
  __m128 _s_8;
  float *ptr_8;
  int i_8;
  int h_3;
  int w_5;
  __m128 _s_7;
  __m128 _p_7;
  float *ptr_7;
  int i_7;
  __m128 _bias_3;
  __m128 _s_6;
  __m128 _p_6;
  float *ptr_6;
  int i_6;
  float *bias_1;
  float *scale_1;
  int w_4;
  __m256 _p_5;
  int i_5;
  __m256 _s_5;
  float *ptr_5;
  int q_1;
  __m256 _p_4;
  int i_4;
  __m256 _bias_2;
  __m256 _s_4;
  float *ptr_4;
  int q;
  int size_1;
  int channels_1;
  int h_2;
  int w_3;
  __m256 _p_3;
  int j_1;
  __m256 _s_3;
  float *ptr_3;
  int i_3;
  __m256 _p_2;
  int j;
  __m256 _bias_1;
  __m256 _s_2;
  float *ptr_2;
  int i_2;
  int h_1;
  int w_2;
  __m256 _s_1;
  __m256 _p_1;
  float *ptr_1;
  int i_1;
  __m256 _bias;
  __m256 _s;
  __m256 _p;
  float *ptr;
  int i;
  float *bias;
  float *scale;
  int w_1;
  int elempack;
  int dims;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  undefined8 in_stack_ffffffffffffed68;
  Mat *this_00;
  Mat *in_stack_ffffffffffffed70;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  uint local_11ec;
  int local_11e8;
  Mat local_11e0;
  float *local_1198;
  int local_118c;
  float *local_1188;
  undefined1 local_1180 [16];
  undefined8 uStack_1170;
  undefined8 local_1160;
  Option *in_stack_ffffffffffffeea8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffeeb0;
  Scale *in_stack_ffffffffffffeeb8;
  uint local_1118;
  int local_1114;
  Mat local_1108;
  Mat *local_10c0;
  int local_10b4;
  float *local_10b0;
  float *local_10a8;
  uint local_10a0;
  int local_109c;
  int local_1098;
  int local_1094;
  float local_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  int local_1074;
  undefined8 local_1070;
  undefined8 uStack_1068;
  Mat local_1058;
  undefined1 (*local_1010) [12];
  int local_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  int local_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  Mat local_fb8;
  float *local_f70;
  int local_f64;
  int local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  float local_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  int local_f34;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined1 (*local_f20) [12];
  int local_f14;
  undefined8 local_f10;
  undefined8 uStack_f08;
  int local_ef4;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  float *local_ec8;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  undefined1 (*local_e90) [12];
  int local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  float *local_e48;
  int local_e3c;
  float *local_e38;
  float *local_e30;
  int local_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  int local_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  Mat local_db8;
  float *local_d70;
  int local_d64;
  undefined1 local_d60 [32];
  int local_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  Mat local_cc8;
  undefined1 (*local_c80) [32];
  int local_c74;
  int local_c70;
  int local_c6c;
  int local_c68;
  int local_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  int local_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float *local_bf0;
  int local_be4;
  undefined1 local_be0 [32];
  int local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 (*local_b58) [32];
  int local_b4c;
  int local_b48;
  int local_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float *local_af0;
  int local_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [32];
  undefined1 (*local_a68) [32];
  int local_a5c;
  float *local_a58;
  float *local_a50;
  int local_a44;
  int local_a40;
  int local_a3c;
  reference local_a38;
  reference local_a30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a20;
  int local_a0c;
  float *local_a08;
  Mat *local_a00;
  float *local_9f8;
  float *local_9f0;
  undefined1 (*local_9e8) [32];
  undefined1 (*local_9e0) [32];
  float *local_9d8;
  float *local_9d0;
  float *local_9c8;
  undefined1 (*local_9c0) [32];
  undefined1 (*local_9b8) [32];
  float *local_9b0;
  float *local_9a8;
  float *local_9a0;
  undefined1 (*local_998) [32];
  undefined1 (*local_990) [32];
  undefined1 (*local_988) [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float *local_7c8;
  void *local_7c0;
  int *piStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  Mat *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 (*local_708) [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 (*local_688) [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 (*local_608) [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 (*local_4e8) [12];
  float *local_4e0;
  float *local_4d8;
  float *local_4d0;
  float *local_4c8;
  undefined1 (*local_4c0) [12];
  float *local_4b8;
  float *local_4b0;
  float *local_4a8;
  float *local_4a0;
  float *local_498;
  undefined1 (*local_490) [12];
  float *local_488;
  float *local_480;
  float *local_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 (*local_338) [12];
  undefined8 local_330;
  undefined8 uStack_328;
  float *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 (*local_2f8) [12];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 (*local_2b8) [12];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float *local_298;
  float local_28c;
  float local_288;
  float local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_a20 = in_RSI;
  local_a30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_a38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a20,1);
  local_a3c = local_a30->dims;
  local_a40 = local_a30->elempack;
  if (local_a40 == 8) {
    if (local_a3c == 1) {
      local_a44 = local_a30->w;
      local_a50 = ncnn::Mat::operator_cast_to_float_(local_a38);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_ae4 = 0; local_ae4 < local_a44; local_ae4 = local_ae4 + 1) {
          local_af0 = ncnn::Mat::operator_cast_to_float_(local_a30);
          local_af0 = local_af0 + (local_ae4 << 3);
          uVar3 = *(undefined8 *)local_af0;
          uVar4 = *(undefined8 *)(local_af0 + 2);
          uVar5 = *(undefined8 *)(local_af0 + 4);
          uVar6 = *(undefined8 *)(local_af0 + 6);
          local_9a8 = local_a50 + (local_ae4 << 3);
          local_b40 = *(undefined8 *)local_9a8;
          uStack_b38 = *(undefined8 *)(local_9a8 + 2);
          uStack_b30 = *(undefined8 *)(local_9a8 + 4);
          uStack_b28 = *(undefined8 *)(local_9a8 + 6);
          local_520._0_4_ = (float)uVar3;
          local_520._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_518._0_4_ = (float)uVar4;
          uStack_518._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_510._0_4_ = (float)uVar5;
          uStack_510._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_508._0_4_ = (float)uVar6;
          uStack_508._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_540._0_4_ = (float)local_b40;
          local_540._4_4_ = (float)((ulong)local_b40 >> 0x20);
          uStack_538._0_4_ = (float)uStack_b38;
          uStack_538._4_4_ = (float)((ulong)uStack_b38 >> 0x20);
          uStack_530._0_4_ = (float)uStack_b30;
          uStack_530._4_4_ = (float)((ulong)uStack_b30 >> 0x20);
          uStack_528._0_4_ = (float)uStack_b28;
          local_b20 = CONCAT44(local_520._4_4_ * local_540._4_4_,(float)local_520 * (float)local_540
                              );
          uStack_b18 = CONCAT44(uStack_518._4_4_ * uStack_538._4_4_,
                                (float)uStack_518 * (float)uStack_538);
          uStack_b10 = CONCAT44(uStack_510._4_4_ * uStack_530._4_4_,
                                (float)uStack_510 * (float)uStack_530);
          uStack_b08 = CONCAT44(uStack_508._4_4_,(float)uStack_508 * (float)uStack_528);
          local_680 = local_b20;
          uStack_678 = uStack_b18;
          uStack_670 = uStack_b10;
          uStack_668 = uStack_b08;
          *(undefined8 *)local_af0 = local_b20;
          *(undefined8 *)(local_af0 + 2) = uStack_b18;
          *(undefined8 *)(local_af0 + 4) = uStack_b10;
          *(undefined8 *)(local_af0 + 6) = uStack_b08;
          local_9a0 = local_af0;
          local_648 = local_af0;
          local_540 = local_b40;
          uStack_538 = uStack_b38;
          uStack_530 = uStack_b30;
          uStack_528 = uStack_b28;
          local_520 = uVar3;
          uStack_518 = uVar4;
          uStack_510 = uVar5;
          uStack_508 = uVar6;
        }
      }
      else {
        local_a58 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
        for (local_a5c = 0; local_a5c < local_a44; local_a5c = local_a5c + 1) {
          pfVar18 = ncnn::Mat::operator_cast_to_float_(local_a30);
          local_a68 = (undefined1 (*) [32])(pfVar18 + (local_a5c << 3));
          auVar13 = *(undefined1 (*) [24])*local_a68;
          uStack_808 = *(undefined8 *)(*local_a68 + 0x18);
          local_990 = (undefined1 (*) [32])(local_a50 + (local_a5c << 3));
          local_ac0 = *(undefined8 *)*local_990;
          uStack_ab8 = *(undefined8 *)(*local_990 + 8);
          uStack_ab0 = *(undefined8 *)(*local_990 + 0x10);
          uStack_aa8 = *(undefined8 *)(*local_990 + 0x18);
          local_998 = (undefined1 (*) [32])(local_a58 + (local_a5c << 3));
          local_ae0 = *(undefined8 *)*local_998;
          uStack_ad8 = *(undefined8 *)(*local_998 + 8);
          uStack_ad0 = *(undefined8 *)(*local_998 + 0x10);
          uStack_ac8 = *(undefined8 *)(*local_998 + 0x18);
          local_aa0._0_8_ = auVar13._0_8_;
          local_820 = local_aa0._0_8_;
          local_aa0._8_8_ = auVar13._8_8_;
          uStack_818 = local_aa0._8_8_;
          local_aa0._16_8_ = auVar13._16_8_;
          uStack_810 = local_aa0._16_8_;
          local_240 = local_aa0._0_8_;
          uStack_238 = local_aa0._8_8_;
          uStack_230 = local_aa0._16_8_;
          auVar2 = vfmadd213ps_fma(*local_990,*local_a68,*local_998);
          local_aa0._0_8_ = auVar2._0_8_;
          local_640 = local_aa0._0_8_;
          local_aa0._8_8_ = auVar2._8_8_;
          uStack_638 = local_aa0._8_8_;
          uStack_630 = 0;
          uStack_628 = 0;
          *(undefined8 *)*local_a68 = local_aa0._0_8_;
          *(undefined8 *)(*local_a68 + 8) = local_aa0._8_8_;
          *(undefined8 *)(*local_a68 + 0x10) = 0;
          *(undefined8 *)(*local_a68 + 0x18) = 0;
          local_aa0 = ZEXT1632(auVar2);
          local_988 = local_a68;
          local_860 = local_ae0;
          uStack_858 = uStack_ad8;
          uStack_850 = uStack_ad0;
          uStack_848 = uStack_ac8;
          local_840 = local_ac0;
          uStack_838 = uStack_ab8;
          uStack_830 = uStack_ab0;
          uStack_828 = uStack_aa8;
          local_608 = local_a68;
          local_280 = local_ae0;
          uStack_278 = uStack_ad8;
          uStack_270 = uStack_ad0;
          uStack_268 = uStack_ac8;
          local_260 = local_ac0;
          uStack_258 = uStack_ab8;
          uStack_250 = uStack_ab0;
          uStack_248 = uStack_aa8;
          uStack_228 = uStack_808;
        }
      }
    }
    if (local_a3c == 2) {
      local_b44 = local_a30->w;
      local_b48 = local_a30->h;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_be4 = 0; local_be4 < local_b48; local_be4 = local_be4 + 1) {
          local_bf0 = ncnn::Mat::row(local_a30,local_be4);
          local_9c8 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_9c8 = local_9c8 + (local_be4 << 3);
          local_c20 = *(undefined8 *)local_9c8;
          uStack_c18 = *(undefined8 *)(local_9c8 + 2);
          uStack_c10 = *(undefined8 *)(local_9c8 + 4);
          uStack_c08 = *(undefined8 *)(local_9c8 + 6);
          for (local_c24 = 0; local_c24 < local_b44; local_c24 = local_c24 + 1) {
            local_9d0 = local_bf0;
            uVar3 = *(undefined8 *)local_bf0;
            uVar4 = *(undefined8 *)(local_bf0 + 2);
            uVar5 = *(undefined8 *)(local_bf0 + 4);
            uVar6 = *(undefined8 *)(local_bf0 + 6);
            local_560._0_4_ = (float)uVar3;
            local_560._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_558._0_4_ = (float)uVar4;
            uStack_558._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_550._0_4_ = (float)uVar5;
            uStack_550._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_548._0_4_ = (float)uVar6;
            uStack_548._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_580._0_4_ = (float)local_c20;
            local_580._4_4_ = (float)((ulong)local_c20 >> 0x20);
            uStack_578._0_4_ = (float)uStack_c18;
            uStack_578._4_4_ = (float)((ulong)uStack_c18 >> 0x20);
            uStack_570._0_4_ = (float)uStack_c10;
            uStack_570._4_4_ = (float)((ulong)uStack_c10 >> 0x20);
            uStack_568._0_4_ = (float)uStack_c08;
            local_c60 = CONCAT44(local_560._4_4_ * local_580._4_4_,
                                 (float)local_560 * (float)local_580);
            uStack_c58 = CONCAT44(uStack_558._4_4_ * uStack_578._4_4_,
                                  (float)uStack_558 * (float)uStack_578);
            uStack_c50 = CONCAT44(uStack_550._4_4_ * uStack_570._4_4_,
                                  (float)uStack_550 * (float)uStack_570);
            uStack_c48 = CONCAT44(uStack_548._4_4_,(float)uStack_548 * (float)uStack_568);
            local_6c8 = local_bf0;
            local_700 = local_c60;
            uStack_6f8 = uStack_c58;
            uStack_6f0 = uStack_c50;
            uStack_6e8 = uStack_c48;
            *(undefined8 *)local_bf0 = local_c60;
            *(undefined8 *)(local_bf0 + 2) = uStack_c58;
            *(undefined8 *)(local_bf0 + 4) = uStack_c50;
            *(undefined8 *)(local_bf0 + 6) = uStack_c48;
            local_bf0 = local_bf0 + 8;
            local_580 = local_c20;
            uStack_578 = uStack_c18;
            uStack_570 = uStack_c10;
            uStack_568 = uStack_c08;
            local_560 = uVar3;
            uStack_558 = uVar4;
            uStack_550 = uVar5;
            uStack_548 = uVar6;
          }
        }
      }
      else {
        for (local_b4c = 0; local_b4c < local_b48; local_b4c = local_b4c + 1) {
          local_b58 = (undefined1 (*) [32])ncnn::Mat::row(local_a30,local_b4c);
          local_9b0 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_9b0 = local_9b0 + (local_b4c << 3);
          local_b80 = *(undefined8 *)local_9b0;
          uStack_b78 = *(undefined8 *)(local_9b0 + 2);
          uStack_b70 = *(undefined8 *)(local_9b0 + 4);
          uStack_b68 = *(undefined8 *)(local_9b0 + 6);
          pfVar18 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_9b8 = (undefined1 (*) [32])(pfVar18 + (local_b4c << 3));
          local_ba0 = *(undefined8 *)*local_9b8;
          uStack_b98 = *(undefined8 *)(*local_9b8 + 8);
          uStack_b90 = *(undefined8 *)(*local_9b8 + 0x10);
          uStack_b88 = *(undefined8 *)(*local_9b8 + 0x18);
          auVar22 = *local_9b8;
          for (local_ba4 = 0; local_ba4 < local_b44; local_ba4 = local_ba4 + 1) {
            local_9c0 = local_b58;
            auVar13 = *(undefined1 (*) [24])*local_b58;
            uStack_868 = *(undefined8 *)(*local_b58 + 0x18);
            local_be0._0_8_ = auVar13._0_8_;
            local_880 = local_be0._0_8_;
            local_be0._8_8_ = auVar13._8_8_;
            uStack_878 = local_be0._8_8_;
            local_be0._16_8_ = auVar13._16_8_;
            uStack_870 = local_be0._16_8_;
            local_8a0 = local_b80;
            uStack_898 = uStack_b78;
            uStack_890 = uStack_b70;
            uStack_888 = uStack_b68;
            local_1e0 = local_be0._0_8_;
            uStack_1d8 = local_be0._8_8_;
            uStack_1d0 = local_be0._16_8_;
            local_200 = local_b80;
            uStack_1f8 = uStack_b78;
            uStack_1f0 = uStack_b70;
            uStack_1e8 = uStack_b68;
            auVar8._8_8_ = uStack_b78;
            auVar8._0_8_ = local_b80;
            auVar8._16_8_ = uStack_b70;
            auVar8._24_8_ = uStack_b68;
            auVar2 = vfmadd213ps_fma(auVar8,*local_b58,auVar22);
            local_688 = local_b58;
            local_be0._0_8_ = auVar2._0_8_;
            local_6c0 = local_be0._0_8_;
            local_be0._8_8_ = auVar2._8_8_;
            uStack_6b8 = local_be0._8_8_;
            uStack_6b0 = 0;
            uStack_6a8 = 0;
            *(undefined8 *)*local_b58 = local_be0._0_8_;
            *(undefined8 *)(*local_b58 + 8) = local_be0._8_8_;
            *(undefined8 *)(*local_b58 + 0x10) = 0;
            *(undefined8 *)(*local_b58 + 0x18) = 0;
            local_b58 = local_b58 + 1;
            local_be0 = ZEXT1632(auVar2);
            local_8c0 = local_ba0;
            uStack_8b8 = uStack_b98;
            uStack_8b0 = uStack_b90;
            uStack_8a8 = uStack_b88;
            local_220 = local_ba0;
            uStack_218 = uStack_b98;
            uStack_210 = uStack_b90;
            uStack_208 = uStack_b88;
            uStack_1c8 = uStack_868;
          }
        }
      }
    }
    if (local_a3c == 3) {
      local_c64 = local_a30->w;
      local_c68 = local_a30->h;
      local_c6c = local_a30->c;
      local_c70 = local_c64 * local_c68;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_d64 = 0; local_d64 < local_c6c; local_d64 = local_d64 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffed70,
                             (int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
          pfVar18 = ncnn::Mat::operator_cast_to_float_(&local_db8);
          ncnn::Mat::~Mat((Mat *)0x50504e);
          local_d70 = pfVar18;
          local_9f0 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_9f0 = local_9f0 + (local_d64 << 3);
          local_de0 = *(undefined8 *)local_9f0;
          uStack_dd8 = *(undefined8 *)(local_9f0 + 2);
          uStack_dd0 = *(undefined8 *)(local_9f0 + 4);
          uStack_dc8 = *(undefined8 *)(local_9f0 + 6);
          for (local_de4 = 0; local_de4 < local_c70; local_de4 = local_de4 + 1) {
            local_9f8 = local_d70;
            uVar3 = *(undefined8 *)local_d70;
            uVar4 = *(undefined8 *)(local_d70 + 2);
            uVar5 = *(undefined8 *)(local_d70 + 4);
            uVar6 = *(undefined8 *)(local_d70 + 6);
            local_5a0._0_4_ = (float)uVar3;
            local_5a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_598._0_4_ = (float)uVar4;
            uStack_598._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_590._0_4_ = (float)uVar5;
            uStack_590._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_588._0_4_ = (float)uVar6;
            uStack_588._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_5c0._0_4_ = (float)local_de0;
            local_5c0._4_4_ = (float)((ulong)local_de0 >> 0x20);
            uStack_5b8._0_4_ = (float)uStack_dd8;
            uStack_5b8._4_4_ = (float)((ulong)uStack_dd8 >> 0x20);
            uStack_5b0._0_4_ = (float)uStack_dd0;
            uStack_5b0._4_4_ = (float)((ulong)uStack_dd0 >> 0x20);
            uStack_5a8._0_4_ = (float)uStack_dc8;
            local_e20 = CONCAT44(local_5a0._4_4_ * local_5c0._4_4_,
                                 (float)local_5a0 * (float)local_5c0);
            uStack_e18 = CONCAT44(uStack_598._4_4_ * uStack_5b8._4_4_,
                                  (float)uStack_598 * (float)uStack_5b8);
            uStack_e10 = CONCAT44(uStack_590._4_4_ * uStack_5b0._4_4_,
                                  (float)uStack_590 * (float)uStack_5b0);
            uStack_e08 = CONCAT44(uStack_588._4_4_,(float)uStack_588 * (float)uStack_5a8);
            local_748 = local_d70;
            local_780 = local_e20;
            uStack_778 = uStack_e18;
            uStack_770 = uStack_e10;
            uStack_768 = uStack_e08;
            *(undefined8 *)local_d70 = local_e20;
            *(undefined8 *)(local_d70 + 2) = uStack_e18;
            *(undefined8 *)(local_d70 + 4) = uStack_e10;
            *(undefined8 *)(local_d70 + 6) = uStack_e08;
            local_d70 = local_d70 + 8;
            local_5c0 = local_de0;
            uStack_5b8 = uStack_dd8;
            uStack_5b0 = uStack_dd0;
            uStack_5a8 = uStack_dc8;
            local_5a0 = uVar3;
            uStack_598 = uVar4;
            uStack_590 = uVar5;
            uStack_588 = uVar6;
          }
        }
      }
      else {
        for (local_c74 = 0; local_c74 < local_c6c; local_c74 = local_c74 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffed70,
                             (int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
          pauVar19 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_cc8);
          ncnn::Mat::~Mat((Mat *)0x504dd9);
          local_c80 = pauVar19;
          local_9d8 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_9d8 = local_9d8 + (local_c74 << 3);
          local_d00 = *(undefined8 *)local_9d8;
          uStack_cf8 = *(undefined8 *)(local_9d8 + 2);
          uStack_cf0 = *(undefined8 *)(local_9d8 + 4);
          uStack_ce8 = *(undefined8 *)(local_9d8 + 6);
          pfVar18 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_9e0 = (undefined1 (*) [32])(pfVar18 + (local_c74 << 3));
          local_d20 = *(undefined8 *)*local_9e0;
          uStack_d18 = *(undefined8 *)(*local_9e0 + 8);
          uStack_d10 = *(undefined8 *)(*local_9e0 + 0x10);
          uStack_d08 = *(undefined8 *)(*local_9e0 + 0x18);
          auVar22 = *local_9e0;
          for (local_d24 = 0; local_d24 < local_c70; local_d24 = local_d24 + 1) {
            local_9e8 = local_c80;
            auVar13 = *(undefined1 (*) [24])*local_c80;
            uStack_8c8 = *(undefined8 *)(*local_c80 + 0x18);
            local_d60._0_8_ = auVar13._0_8_;
            local_8e0 = local_d60._0_8_;
            local_d60._8_8_ = auVar13._8_8_;
            uStack_8d8 = local_d60._8_8_;
            local_d60._16_8_ = auVar13._16_8_;
            uStack_8d0 = local_d60._16_8_;
            local_900 = local_d00;
            uStack_8f8 = uStack_cf8;
            uStack_8f0 = uStack_cf0;
            uStack_8e8 = uStack_ce8;
            local_180 = local_d60._0_8_;
            uStack_178 = local_d60._8_8_;
            uStack_170 = local_d60._16_8_;
            local_1a0 = local_d00;
            uStack_198 = uStack_cf8;
            uStack_190 = uStack_cf0;
            uStack_188 = uStack_ce8;
            auVar9._8_8_ = uStack_cf8;
            auVar9._0_8_ = local_d00;
            auVar9._16_8_ = uStack_cf0;
            auVar9._24_8_ = uStack_ce8;
            auVar2 = vfmadd213ps_fma(auVar9,*local_c80,auVar22);
            local_708 = local_c80;
            local_d60._0_8_ = auVar2._0_8_;
            local_740 = local_d60._0_8_;
            local_d60._8_8_ = auVar2._8_8_;
            uStack_738 = local_d60._8_8_;
            uStack_730 = 0;
            uStack_728 = 0;
            *(undefined8 *)*local_c80 = local_d60._0_8_;
            *(undefined8 *)(*local_c80 + 8) = local_d60._8_8_;
            *(undefined8 *)(*local_c80 + 0x10) = 0;
            *(undefined8 *)(*local_c80 + 0x18) = 0;
            local_c80 = local_c80 + 1;
            local_d60 = ZEXT1632(auVar2);
            local_920 = local_d20;
            uStack_918 = uStack_d18;
            uStack_910 = uStack_d10;
            uStack_908 = uStack_d08;
            local_1c0 = local_d20;
            uStack_1b8 = uStack_d18;
            uStack_1b0 = uStack_d10;
            uStack_1a8 = uStack_d08;
            uStack_168 = uStack_8c8;
          }
        }
      }
    }
    local_a0c = 0;
  }
  else if (local_a40 == 4) {
    if (local_a3c == 1) {
      local_e24 = local_a30->w;
      local_e30 = ncnn::Mat::operator_cast_to_float_(local_a38);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_e84 = 0; local_e84 < local_e24; local_e84 = local_e84 + 1) {
          pfVar18 = ncnn::Mat::operator_cast_to_float_(local_a30);
          local_e90 = (undefined1 (*) [12])(pfVar18 + (local_e84 << 2));
          auVar12 = *local_e90;
          fStack_e94 = (float)((ulong)*(undefined8 *)(*local_e90 + 8) >> 0x20);
          local_498 = local_e30 + (local_e84 << 2);
          local_eb0 = *(undefined8 *)local_498;
          uStack_ea8 = *(undefined8 *)(local_498 + 2);
          auVar2._12_4_ = fStack_e94;
          auVar2._0_12_ = auVar12;
          local_380._0_4_ = auVar12._0_4_;
          local_380._4_4_ = auVar12._4_4_;
          fStack_378 = auVar12._8_4_;
          local_390._0_4_ = (float)local_eb0;
          local_390._4_4_ = (float)((ulong)local_eb0 >> 0x20);
          uStack_388._0_4_ = (float)uStack_ea8;
          uStack_388._4_4_ = (float)((ulong)uStack_ea8 >> 0x20);
          local_ea0 = (float)local_380._0_4_ * (float)local_390;
          fStack_e9c = (float)local_380._4_4_ * local_390._4_4_;
          fStack_e98 = fStack_378 * (float)uStack_388;
          fStack_e94 = fStack_e94 * uStack_388._4_4_;
          local_2d0 = CONCAT44(fStack_e9c,local_ea0);
          uStack_2c8 = CONCAT44(fStack_e94,fStack_e98);
          *(undefined8 *)*local_e90 = local_2d0;
          *(undefined8 *)(*local_e90 + 8) = uStack_2c8;
          local_490 = local_e90;
          local_390 = local_eb0;
          uStack_388 = uStack_ea8;
          _local_380 = auVar2;
          local_2b8 = local_e90;
        }
      }
      else {
        local_e38 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
        for (local_e3c = 0; local_e3c < local_e24; local_e3c = local_e3c + 1) {
          local_e48 = ncnn::Mat::operator_cast_to_float_(local_a30);
          local_e48 = local_e48 + (local_e3c << 2);
          uVar3 = *(undefined8 *)local_e48;
          uVar4 = *(undefined8 *)(local_e48 + 2);
          local_480 = local_e30 + (local_e3c << 2);
          local_e70 = *(undefined8 *)local_480;
          uStack_e68 = *(undefined8 *)(local_480 + 2);
          local_488 = local_e38 + (local_e3c << 2);
          local_e80 = *(undefined8 *)local_488;
          uStack_e78 = *(undefined8 *)(local_488 + 2);
          local_360._0_4_ = (float)uVar3;
          local_360._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_358._0_4_ = (float)uVar4;
          uStack_358._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_370._0_4_ = (float)local_e70;
          local_370._4_4_ = (float)((ulong)local_e70 >> 0x20);
          uStack_368._0_4_ = (float)uStack_e68;
          uStack_368._4_4_ = (float)((ulong)uStack_e68 >> 0x20);
          local_420._0_4_ = (float)local_360 * (float)local_370;
          local_420._4_4_ = local_360._4_4_ * local_370._4_4_;
          local_420._8_4_ = (float)uStack_358 * (float)uStack_368;
          local_420._12_4_ = uStack_358._4_4_ * uStack_368._4_4_;
          local_430._0_4_ = (float)local_e80;
          local_430._4_4_ = (float)((ulong)local_e80 >> 0x20);
          uStack_428._0_4_ = (float)uStack_e78;
          uStack_428._4_4_ = (float)((ulong)uStack_e78 >> 0x20);
          local_e60 = CONCAT44(local_420._4_4_ + local_430._4_4_,local_420._0_4_ + (float)local_430)
          ;
          uStack_e58 = CONCAT44(local_420._12_4_ + uStack_428._4_4_,
                                local_420._8_4_ + (float)uStack_428);
          local_2b0 = local_e60;
          uStack_2a8 = uStack_e58;
          *(undefined8 *)local_e48 = local_e60;
          *(undefined8 *)(local_e48 + 2) = uStack_e58;
          local_478 = local_e48;
          local_430 = local_e80;
          uStack_428 = uStack_e78;
          local_370 = local_e70;
          uStack_368 = uStack_e68;
          local_360 = uVar3;
          uStack_358 = uVar4;
          local_298 = local_e48;
        }
      }
    }
    if (local_a3c == 2) {
      local_eb4 = local_a30->w;
      local_eb8 = local_a30->h;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_f14 = 0; local_f14 < local_eb8; local_f14 = local_f14 + 1) {
          local_f20 = (undefined1 (*) [12])ncnn::Mat::row(local_a30,local_f14);
          local_4b8 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_4b8 = local_4b8 + (local_f14 << 2);
          local_f30 = *(undefined8 *)local_4b8;
          uStack_f28 = *(undefined8 *)(local_4b8 + 2);
          for (local_f34 = 0; local_f34 < local_eb4; local_f34 = local_f34 + 1) {
            local_4c0 = local_f20;
            auVar12 = *local_f20;
            fStack_f44 = (float)((ulong)*(undefined8 *)(*local_f20 + 8) >> 0x20);
            auVar1._12_4_ = fStack_f44;
            auVar1._0_12_ = auVar12;
            local_3c0._0_4_ = auVar12._0_4_;
            local_3c0._4_4_ = auVar12._4_4_;
            fStack_3b8 = auVar12._8_4_;
            local_3d0._0_4_ = (float)local_f30;
            local_3d0._4_4_ = (float)((ulong)local_f30 >> 0x20);
            uStack_3c8._0_4_ = (float)uStack_f28;
            uStack_3c8._4_4_ = (float)((ulong)uStack_f28 >> 0x20);
            local_f50 = (float)local_3c0._0_4_ * (float)local_3d0;
            fStack_f4c = (float)local_3c0._4_4_ * local_3d0._4_4_;
            fStack_f48 = fStack_3b8 * (float)uStack_3c8;
            fStack_f44 = fStack_f44 * uStack_3c8._4_4_;
            local_2f8 = local_f20;
            local_310 = CONCAT44(fStack_f4c,local_f50);
            uStack_308 = CONCAT44(fStack_f44,fStack_f48);
            *(undefined8 *)*local_f20 = local_310;
            *(undefined8 *)(*local_f20 + 8) = uStack_308;
            local_f20 = (undefined1 (*) [12])(local_f20[1] + 4);
            local_3d0 = local_f30;
            uStack_3c8 = uStack_f28;
            _local_3c0 = auVar1;
          }
        }
      }
      else {
        for (local_ebc = 0; local_ebc < local_eb8; local_ebc = local_ebc + 1) {
          local_ec8 = ncnn::Mat::row(local_a30,local_ebc);
          local_4a0 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_4a0 = local_4a0 + (local_ebc << 2);
          local_ee0 = *(undefined8 *)local_4a0;
          uStack_ed8 = *(undefined8 *)(local_4a0 + 2);
          local_4a8 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_4a8 = local_4a8 + (local_ebc << 2);
          local_ef0 = *(undefined8 *)local_4a8;
          uStack_ee8 = *(undefined8 *)(local_4a8 + 2);
          for (local_ef4 = 0; local_ef4 < local_eb4; local_ef4 = local_ef4 + 1) {
            local_4b0 = local_ec8;
            uVar3 = *(undefined8 *)local_ec8;
            uVar4 = *(undefined8 *)(local_ec8 + 2);
            local_3a0._0_4_ = (float)uVar3;
            local_3a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_398._0_4_ = (float)uVar4;
            uStack_398._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_3b0._0_4_ = (float)local_ee0;
            local_3b0._4_4_ = (float)((ulong)local_ee0 >> 0x20);
            uStack_3a8._0_4_ = (float)uStack_ed8;
            uStack_3a8._4_4_ = (float)((ulong)uStack_ed8 >> 0x20);
            local_440._0_4_ = (float)local_3a0 * (float)local_3b0;
            local_440._4_4_ = local_3a0._4_4_ * local_3b0._4_4_;
            local_440._8_4_ = (float)uStack_398 * (float)uStack_3a8;
            local_440._12_4_ = uStack_398._4_4_ * uStack_3a8._4_4_;
            local_450._0_4_ = (float)local_ef0;
            local_450._4_4_ = (float)((ulong)local_ef0 >> 0x20);
            uStack_448._0_4_ = (float)uStack_ee8;
            uStack_448._4_4_ = (float)((ulong)uStack_ee8 >> 0x20);
            local_f10 = CONCAT44(local_440._4_4_ + local_450._4_4_,
                                 local_440._0_4_ + (float)local_450);
            uStack_f08 = CONCAT44(local_440._12_4_ + uStack_448._4_4_,
                                  local_440._8_4_ + (float)uStack_448);
            local_2d8 = local_ec8;
            local_2f0 = local_f10;
            uStack_2e8 = uStack_f08;
            *(undefined8 *)local_ec8 = local_f10;
            *(undefined8 *)(local_ec8 + 2) = uStack_f08;
            local_ec8 = local_ec8 + 4;
            local_450 = local_ef0;
            uStack_448 = uStack_ee8;
            local_3b0 = local_ee0;
            uStack_3a8 = uStack_ed8;
            local_3a0 = uVar3;
            uStack_398 = uVar4;
          }
        }
      }
    }
    if (local_a3c == 3) {
      local_f54 = local_a30->w;
      local_f58 = local_a30->h;
      local_f5c = local_a30->c;
      local_f60 = local_f54 * local_f58;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_1004 = 0; local_1004 < local_f5c; local_1004 = local_1004 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffed70,
                             (int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
          pauVar20 = (undefined1 (*) [12])ncnn::Mat::operator_cast_to_float_(&local_1058);
          ncnn::Mat::~Mat((Mat *)0x505bef);
          local_1010 = pauVar20;
          local_4e0 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_4e0 = local_4e0 + (local_1004 << 2);
          local_1070 = *(undefined8 *)local_4e0;
          uStack_1068 = *(undefined8 *)(local_4e0 + 2);
          for (local_1074 = 0; local_1074 < local_f60; local_1074 = local_1074 + 1) {
            local_4e8 = local_1010;
            auVar12 = *local_1010;
            fStack_1084 = (float)((ulong)*(undefined8 *)(*local_1010 + 8) >> 0x20);
            auVar7._12_4_ = fStack_1084;
            auVar7._0_12_ = auVar12;
            local_400._0_4_ = auVar12._0_4_;
            local_400._4_4_ = auVar12._4_4_;
            fStack_3f8 = auVar12._8_4_;
            local_410._0_4_ = (float)local_1070;
            local_410._4_4_ = (float)((ulong)local_1070 >> 0x20);
            uStack_408._0_4_ = (float)uStack_1068;
            uStack_408._4_4_ = (float)((ulong)uStack_1068 >> 0x20);
            local_1090 = (float)local_400._0_4_ * (float)local_410;
            fStack_108c = (float)local_400._4_4_ * local_410._4_4_;
            fStack_1088 = fStack_3f8 * (float)uStack_408;
            fStack_1084 = fStack_1084 * uStack_408._4_4_;
            local_338 = local_1010;
            local_350 = CONCAT44(fStack_108c,local_1090);
            uStack_348 = CONCAT44(fStack_1084,fStack_1088);
            *(undefined8 *)*local_1010 = local_350;
            *(undefined8 *)(*local_1010 + 8) = uStack_348;
            local_1010 = (undefined1 (*) [12])(local_1010[1] + 4);
            local_410 = local_1070;
            uStack_408 = uStack_1068;
            _local_400 = auVar7;
          }
        }
      }
      else {
        for (local_f64 = 0; local_f64 < local_f5c; local_f64 = local_f64 + 1) {
          ncnn::Mat::channel(in_stack_ffffffffffffed70,
                             (int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
          pfVar18 = ncnn::Mat::operator_cast_to_float_(&local_fb8);
          ncnn::Mat::~Mat((Mat *)0x5059a9);
          local_f70 = pfVar18;
          local_4c8 = ncnn::Mat::operator_cast_to_float_(local_a38);
          local_4c8 = local_4c8 + (local_f64 << 2);
          local_fd0 = *(undefined8 *)local_4c8;
          uStack_fc8 = *(undefined8 *)(local_4c8 + 2);
          local_4d0 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_4d0 = local_4d0 + (local_f64 << 2);
          local_fe0 = *(undefined8 *)local_4d0;
          uStack_fd8 = *(undefined8 *)(local_4d0 + 2);
          for (local_fe4 = 0; local_fe4 < local_f60; local_fe4 = local_fe4 + 1) {
            local_4d8 = local_f70;
            uVar3 = *(undefined8 *)local_f70;
            uVar4 = *(undefined8 *)(local_f70 + 2);
            local_3e0._0_4_ = (float)uVar3;
            local_3e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_3d8._0_4_ = (float)uVar4;
            uStack_3d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_3f0._0_4_ = (float)local_fd0;
            local_3f0._4_4_ = (float)((ulong)local_fd0 >> 0x20);
            uStack_3e8._0_4_ = (float)uStack_fc8;
            uStack_3e8._4_4_ = (float)((ulong)uStack_fc8 >> 0x20);
            local_460._0_4_ = (float)local_3e0 * (float)local_3f0;
            local_460._4_4_ = local_3e0._4_4_ * local_3f0._4_4_;
            local_460._8_4_ = (float)uStack_3d8 * (float)uStack_3e8;
            local_460._12_4_ = uStack_3d8._4_4_ * uStack_3e8._4_4_;
            local_470._0_4_ = (float)local_fe0;
            local_470._4_4_ = (float)((ulong)local_fe0 >> 0x20);
            uStack_468._0_4_ = (float)uStack_fd8;
            uStack_468._4_4_ = (float)((ulong)uStack_fd8 >> 0x20);
            local_1000 = CONCAT44(local_460._4_4_ + local_470._4_4_,
                                  local_460._0_4_ + (float)local_470);
            uStack_ff8 = CONCAT44(local_460._12_4_ + uStack_468._4_4_,
                                  local_460._8_4_ + (float)uStack_468);
            local_318 = local_f70;
            local_330 = local_1000;
            uStack_328 = uStack_ff8;
            *(undefined8 *)local_f70 = local_1000;
            *(undefined8 *)(local_f70 + 2) = uStack_ff8;
            local_f70 = local_f70 + 4;
            local_470 = local_fe0;
            uStack_468 = uStack_fd8;
            local_3f0 = local_fd0;
            uStack_3e8 = uStack_fc8;
            local_3e0 = uVar3;
            uStack_3d8 = uVar4;
          }
        }
      }
    }
    local_a0c = 0;
  }
  else if (local_a3c == 3) {
    local_1094 = local_a30->w;
    local_1098 = local_a30->h;
    local_109c = local_a30->c;
    local_10a0 = local_1094 * local_1098;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
      local_1188 = ncnn::Mat::operator_cast_to_float_(local_a38);
      for (local_118c = 0; local_118c < local_109c; local_118c = local_118c + 1) {
        ncnn::Mat::channel(in_stack_ffffffffffffed70,(int)((ulong)in_stack_ffffffffffffed68 >> 0x20)
                          );
        pfVar18 = ncnn::Mat::operator_cast_to_float_(&local_11e0);
        ncnn::Mat::~Mat((Mat *)0x506340);
        local_28c = local_1188[local_118c];
        local_11e8 = (int)local_10a0 >> 3;
        local_11ec = local_10a0 & 7;
        auVar2 = vinsertps_avx(ZEXT416((uint)local_28c),ZEXT416((uint)local_28c),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_28c),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_28c),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_28c),ZEXT416((uint)local_28c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_28c),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_28c),0x30);
        auVar22._16_16_ = auVar2;
        auVar22._0_16_ = auVar1;
        local_80._0_8_ = auVar1._0_8_;
        local_80._8_8_ = auVar1._8_8_;
        local_80._16_8_ = auVar2._0_8_;
        local_80._24_8_ = auVar2._8_8_;
        local_1198 = pfVar18;
        for (; 0 < local_11e8; local_11e8 = local_11e8 + -1) {
          local_a08 = local_1198;
          uVar3 = *(undefined8 *)local_1198;
          uVar4 = *(undefined8 *)(local_1198 + 2);
          uVar5 = *(undefined8 *)(local_1198 + 4);
          uVar6 = *(undefined8 *)(local_1198 + 6);
          local_5e0._0_4_ = (float)uVar3;
          local_5e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_5d8._0_4_ = (float)uVar4;
          uStack_5d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_5d0._0_4_ = (float)uVar5;
          uStack_5d0._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_5c8._0_4_ = (float)uVar6;
          uStack_5c8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          local_600._0_4_ = auVar1._0_4_;
          local_600._4_4_ = auVar1._4_4_;
          uStack_5f8._0_4_ = auVar1._8_4_;
          uStack_5f8._4_4_ = auVar1._12_4_;
          uStack_5f0._0_4_ = auVar2._0_4_;
          uStack_5f0._4_4_ = auVar2._4_4_;
          uStack_5e8._0_4_ = auVar2._8_4_;
          local_1240 = CONCAT44(local_5e0._4_4_ * local_600._4_4_,
                                (float)local_5e0 * (float)local_600);
          uStack_1238 = CONCAT44(uStack_5d8._4_4_ * uStack_5f8._4_4_,
                                 (float)uStack_5d8 * (float)uStack_5f8);
          uStack_1230 = CONCAT44(uStack_5d0._4_4_ * uStack_5f0._4_4_,
                                 (float)uStack_5d0 * (float)uStack_5f0);
          uStack_1228 = CONCAT44(uStack_5c8._4_4_,(float)uStack_5c8 * (float)uStack_5e8);
          local_7c8 = local_1198;
          local_800 = local_1240;
          uStack_7f8 = uStack_1238;
          uStack_7f0 = uStack_1230;
          uStack_7e8 = uStack_1228;
          *(undefined8 *)local_1198 = local_1240;
          *(undefined8 *)(local_1198 + 2) = uStack_1238;
          *(undefined8 *)(local_1198 + 4) = uStack_1230;
          *(undefined8 *)(local_1198 + 6) = uStack_1228;
          local_1198 = local_1198 + 8;
          local_600 = local_80._0_8_;
          uStack_5f8 = local_80._8_8_;
          uStack_5f0 = local_80._16_8_;
          uStack_5e8 = local_80._24_8_;
          local_5e0 = uVar3;
          uStack_5d8 = uVar4;
          uStack_5d0 = uVar5;
          uStack_5c8 = uVar6;
        }
        for (; 0 < (int)local_11ec; local_11ec = local_11ec - 1) {
          *local_1198 = local_28c * *local_1198;
          local_1198 = local_1198 + 1;
        }
        local_80 = auVar22;
        local_50 = local_28c;
        local_4c = local_28c;
        local_48 = local_28c;
        local_44 = local_28c;
        local_40 = local_28c;
        local_3c = local_28c;
        local_38 = local_28c;
        local_34 = local_28c;
      }
    }
    else {
      local_10a8 = ncnn::Mat::operator_cast_to_float_(local_a38);
      local_10b0 = ncnn::Mat::operator_cast_to_float_
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
      for (local_10b4 = 0; local_10b4 < local_109c; local_10b4 = local_10b4 + 1) {
        this_00 = &local_1108;
        ncnn::Mat::channel(in_stack_ffffffffffffed70,(int)((ulong)this_00 >> 0x20));
        in_stack_ffffffffffffed70 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x505ea3);
        local_284 = local_10a8[local_10b4];
        local_288 = local_10b0[local_10b4];
        local_1114 = (int)local_10a0 >> 3;
        local_1118 = local_10a0 & 7;
        auVar2 = vinsertps_avx(ZEXT416((uint)local_284),ZEXT416((uint)local_284),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_284),0x20);
        local_100 = vinsertps_avx(auVar2,ZEXT416((uint)local_284),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_284),ZEXT416((uint)local_284),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_284),0x20);
        auStack_f0 = vinsertps_avx(auVar2,ZEXT416((uint)local_284),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_288),ZEXT416((uint)local_288),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_288),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_288),0x30);
        auVar1 = vinsertps_avx(ZEXT416((uint)local_288),ZEXT416((uint)local_288),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_288),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_288),0x30);
        auVar21._16_16_ = auVar2;
        auVar21._0_16_ = auVar1;
        local_c0._0_8_ = auVar1._0_8_;
        local_c0._8_8_ = auVar1._8_8_;
        local_c0._16_8_ = auVar2._0_8_;
        local_c0._24_8_ = auVar2._8_8_;
        local_1160 = local_c0._0_8_;
        local_10c0 = in_stack_ffffffffffffed70;
        for (; 0 < local_1114; local_1114 = local_1114 + -1) {
          local_a00 = local_10c0;
          uVar14 = local_10c0->data;
          uVar15 = local_10c0->refcount;
          uVar16 = local_10c0->elemsize;
          uStack_928 = *(undefined8 *)&local_10c0->elempack;
          auVar17._0_8_ = local_10c0->data;
          auVar17._8_8_ = local_10c0->refcount;
          auVar17._16_8_ = local_10c0->elemsize;
          auVar17._24_4_ = local_10c0->elempack;
          auVar17._28_4_ = *(undefined4 *)&local_10c0->field_0x1c;
          local_940 = uVar14;
          uStack_938 = uVar15;
          uStack_930 = uVar16;
          local_960 = local_100._0_8_;
          uStack_958 = local_100._8_8_;
          uStack_950 = auStack_f0._0_8_;
          uStack_948 = auStack_f0._8_8_;
          local_980 = local_c0._0_8_;
          uStack_978 = local_c0._8_8_;
          uStack_970 = local_c0._16_8_;
          uStack_968 = local_c0._24_8_;
          local_120 = uVar14;
          uStack_118 = uVar15;
          uStack_110 = uVar16;
          local_140 = local_100._0_8_;
          uStack_138 = local_100._8_8_;
          uStack_130 = auStack_f0._0_8_;
          uStack_128 = auStack_f0._8_8_;
          local_160 = local_c0._0_8_;
          uStack_158 = local_c0._8_8_;
          uStack_150 = local_c0._16_8_;
          uStack_148 = local_c0._24_8_;
          auVar11._16_8_ = auStack_f0._0_8_;
          auVar11._0_16_ = local_100;
          auVar11._24_8_ = auStack_f0._8_8_;
          auVar10._16_8_ = local_c0._16_8_;
          auVar10._0_16_ = auVar1;
          auVar10._24_8_ = local_c0._24_8_;
          auVar2 = vfmadd213ps_fma(auVar11,auVar17,auVar10);
          local_788 = local_10c0;
          local_1180._0_8_ = auVar2._0_8_;
          local_7c0 = (void *)local_1180._0_8_;
          local_1180._8_8_ = auVar2._8_8_;
          piStack_7b8 = (int *)local_1180._8_8_;
          uStack_7b0 = 0;
          uStack_7a8 = 0;
          local_10c0->data = (void *)local_1180._0_8_;
          local_10c0->refcount = (int *)local_1180._8_8_;
          local_10c0->elemsize = 0;
          *(undefined8 *)&local_10c0->elempack = 0;
          local_10c0 = (Mat *)&local_10c0->allocator;
          _local_1180 = ZEXT1632(auVar2);
          uStack_108 = uStack_928;
        }
        for (; 0 < (int)local_1118; local_1118 = local_1118 - 1) {
          *(float *)&local_10c0->data = *(float *)&local_10c0->data * local_284 + local_288;
          local_10c0 = (Mat *)((long)&local_10c0->data + 4);
        }
        local_e0 = local_284;
        local_dc = local_284;
        local_d8 = local_284;
        local_d4 = local_284;
        local_d0 = local_284;
        local_cc = local_284;
        local_c8 = local_284;
        local_c4 = local_284;
        local_c0 = auVar21;
        local_a0 = local_288;
        local_9c = local_288;
        local_98 = local_288;
        local_94 = local_288;
        local_90 = local_288;
        local_8c = local_288;
        local_88 = local_288;
        local_84 = local_288;
      }
    }
    local_a0c = 0;
  }
  else {
    local_a0c = Scale::forward_inplace
                          (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,
                           in_stack_ffffffffffffeea8);
  }
  return local_a0c;
}

Assistant:

int Scale_x86_avx2::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}